

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  ENGINE *e;
  curl_ssl_ctx_callback p_Var1;
  _Bool _Var2;
  int iVar3;
  CURLcode CVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  SSL_CIPHER *c;
  char *pcVar10;
  SSL_METHOD *meth;
  SSL_CTX *pSVar11;
  X509 *type;
  uint *puVar12;
  SSL_SESSION *ses;
  ulong uVar13;
  BIO_METHOD *pBVar14;
  BIO *pBVar15;
  stack_st_X509 *psVar16;
  X509_NAME *pXVar17;
  size_t sVar18;
  undefined8 uVar19;
  ASN1_INTEGER *pAVar20;
  ASN1_STRING *pAVar21;
  X509 *pXVar22;
  X509_EXTENSION *ex;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ulong uVar23;
  ASN1_TIME *pAVar24;
  X509 *pXVar25;
  GENERAL_NAMES *a_00;
  int *piVar26;
  Curl_easy *pCVar27;
  size_t sVar28;
  undefined8 extraout_RAX;
  X509_NAME_ENTRY *ne;
  PKCS12 *p12;
  size_t sVar29;
  OCSP_RESPONSE *resp;
  FILE *pFVar30;
  X509_PUBKEY *pXVar31;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar32;
  OCSP_SINGLERESP *single;
  UI_METHOD *method;
  UI_METHOD *pUVar33;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SSL *pSVar34;
  EVP_PKEY *pEVar35;
  evp_pkey_st *from;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  long lVar36;
  undefined7 uVar38;
  Curl_easy *pCVar37;
  curl_socket_t writefd;
  size_t size;
  size_t size_00;
  uchar *puVar39;
  curl_socket_t readfd0;
  Curl_easy *pCVar40;
  BIGNUM *bn;
  char cVar41;
  ssl_connect_state sVar42;
  int iVar43;
  char *pcVar44;
  connectdata *pcVar45;
  bool bVar46;
  CURLcode CStack_380;
  Curl_easy *local_368;
  char *ptr;
  Curl_easy *local_350;
  Curl_easy *local_348;
  undefined8 local_340;
  X509 *local_338;
  connectdata *local_330;
  X509 *x509;
  X509_ALGOR *palg;
  stack_st_X509 *local_318;
  Curl_easy *local_310;
  X509 *local_308;
  ASN1_BIT_STRING *psig;
  BIGNUM *q;
  _Bool *local_2f0;
  long local_2e8;
  BIO *local_2e0;
  char *local_2d8;
  BIGNUM *iqmp;
  BIGNUM *dmq1;
  BIGNUM *dmp1;
  in6_addr addr;
  uchar protocols [128];
  undefined1 local_38 [8];
  
  lVar36 = (long)sockindex;
  if (conn->ssl[lVar36].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar37 = conn->data;
  local_350 = (Curl_easy *)CONCAT44(local_350._4_4_,conn->sock[lVar36]);
  sVar42 = conn->ssl[lVar36].connecting_state;
  pcVar45 = conn;
  local_330 = conn;
  local_2e8 = lVar36;
  if (sVar42 == ssl_connect_1) {
    sVar42 = ssl_connect_2;
    lVar9 = Curl_timeleft(pCVar37,(timeval *)0x0,true);
    if (lVar9 < 0) {
LAB_0014391a:
      Curl_failf(pCVar37,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    pCVar27 = conn->data;
    iVar3 = conn->sock[local_2e8];
    Curl_ossl_seed(pCVar27);
    (pCVar27->set).ssl.certverifyresult = 1;
    lVar9 = (pCVar27->set).ssl.version;
    if (lVar9 == 2) {
      pcVar44 = "OpenSSL was built without SSLv2 support";
LAB_00143681:
      Curl_failf(pCVar27,pcVar44);
      return CURLE_NOT_BUILT_IN;
    }
    if (lVar9 == 3) {
      pcVar44 = "OpenSSL was built without SSLv3 support";
      goto LAB_00143681;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    pSVar11 = (SSL_CTX *)conn->ssl[lVar36].ctx;
    if (pSVar11 != (SSL_CTX *)0x0) {
      SSL_CTX_free(pSVar11);
    }
    pSVar11 = SSL_CTX_new(meth);
    conn->ssl[lVar36].ctx = (SSL_CTX *)pSVar11;
    if (pSVar11 == (SSL_CTX *)0x0) {
      uVar13 = ERR_peek_error();
      pcVar44 = ERR_error_string(uVar13,(char *)0x0);
      Curl_failf(pCVar27,"SSL: couldn\'t create a context: %s",pcVar44);
      return CURLE_OUT_OF_MEMORY;
    }
    SSL_CTX_ctrl(pSVar11,0x21,0x10,(void *)0x0);
    if (((pCVar27->set).fdebug != (curl_debug_callback)0x0) && ((pCVar27->set).verbose == true)) {
      SSL_CTX_set_msg_callback((SSL_CTX *)conn->ssl[lVar36].ctx,ssl_tls_trace);
      SSL_CTX_ctrl((SSL_CTX *)conn->ssl[lVar36].ctx,0x10,0,conn);
    }
    uVar13 = 0x80024850;
    if ((conn->data->set).ssl_enable_beast == false) {
      uVar13 = 0x80024050;
    }
    uVar23 = (pCVar27->set).ssl.version;
    if ((6 < uVar23) || ((0x7bU >> ((uint)uVar23 & 0x1f) & 1) == 0)) {
      Curl_failf(pCVar27,"Unsupported SSL protocol version");
      return CURLE_SSL_CONNECT_ERROR;
    }
    SSL_CTX_set_options(conn->ssl[lVar36].ctx,uVar13 | *(ulong *)(&DAT_0014fd58 + uVar23 * 8));
    if ((conn->bits).tls_enable_npn == true) {
      SSL_CTX_set_next_proto_select_cb((SSL_CTX *)conn->ssl[lVar36].ctx,select_next_proto_cb,conn);
    }
    local_2f0 = done;
    if ((conn->bits).tls_enable_alpn == true) {
      builtin_memcpy(protocols,"\bhttp/1.1",9);
      Curl_infof(pCVar27,"ALPN, offering %s\n","http/1.1");
      SSL_CTX_set_alpn_protos(conn->ssl[lVar36].ctx,protocols,9);
    }
    pXVar22 = (X509 *)(pCVar27->set).str[0];
    type = (X509 *)(pCVar27->set).str[1];
    if (pXVar22 != (X509 *)0x0 || type != (X509 *)0x0) {
      local_340 = (SSL_CTX *)conn->ssl[lVar36].ctx;
      local_308 = (X509 *)(pCVar27->set).str[0xb];
      local_318 = (stack_st_X509 *)(pCVar27->set).str[0xd];
      local_348 = conn->data;
      local_338 = pXVar22;
      iVar43 = do_file_type((char *)type);
      pSVar11 = local_340;
      if (iVar43 == 0x2a || local_338 != (X509 *)0x0) {
        pcVar44 = (local_348->set).str[0xc];
        pCVar40 = local_348;
        if (pcVar44 != (char *)0x0) {
          SSL_CTX_set_default_passwd_cb_userdata(local_340,pcVar44);
          pCVar40 = local_348;
          SSL_CTX_set_default_passwd_cb(pSVar11,passwd_callback);
        }
        pSVar11 = local_340;
        if (iVar43 == 0x2b) {
          ptr = (char *)0x0;
          pFVar30 = fopen64((char *)local_338,"rb");
          if (pFVar30 == (FILE *)0x0) {
            pcVar44 = "could not open PKCS12 file \'%s\'";
            type = local_338;
LAB_001453cb:
            Curl_failf(pCVar40,pcVar44,type);
            return CURLE_SSL_CERTPROBLEM;
          }
          p12 = d2i_PKCS12_fp(pFVar30,(PKCS12 **)0x0);
          fclose(pFVar30);
          if (p12 == (PKCS12 *)0x0) {
            pcVar44 = "error reading PKCS12 file \'%s\'";
            type = local_338;
            goto LAB_001453cb;
          }
          PKCS12_PBE_add();
          iVar43 = PKCS12_parse(p12,(pCVar40->set).str[0xc],(EVP_PKEY **)protocols,(X509 **)&x509,
                                (stack_st_X509 **)&ptr);
          if (iVar43 == 0) {
            uVar13 = ERR_get_error();
            pcVar44 = ERR_error_string(uVar13,(char *)0x0);
            Curl_failf(pCVar40,"could not parse PKCS12 file, check password, OpenSSL error %s",
                       pcVar44);
            PKCS12_free(p12);
            return CURLE_SSL_CERTPROBLEM;
          }
          PKCS12_free(p12);
          iVar43 = SSL_CTX_use_certificate(local_340,(X509 *)x509);
          if (iVar43 == 1) {
            iVar43 = SSL_CTX_use_PrivateKey
                               (local_340,(EVP_PKEY *)CONCAT71(protocols._1_7_,protocols[0]));
            if (iVar43 == 1) {
              iVar43 = SSL_CTX_check_private_key(local_340);
              pSVar11 = local_340;
              if (iVar43 != 0) {
                if (ptr != (char *)0x0) {
                  do {
                    iVar43 = OPENSSL_sk_num(ptr);
                    if (iVar43 == 0) goto LAB_00145af2;
                    pXVar22 = (X509 *)OPENSSL_sk_pop(ptr);
                    lVar9 = SSL_CTX_ctrl(pSVar11,0xe,0,pXVar22);
                    if (lVar9 == 0) {
                      X509_free(pXVar22);
                      pcVar44 = "cannot add certificate to certificate chain";
                      goto LAB_00145b35;
                    }
                    iVar43 = SSL_CTX_add_client_CA(pSVar11,pXVar22);
                  } while (iVar43 != 0);
                  pcVar44 = "cannot add certificate to client CA list";
LAB_00145b35:
                  Curl_failf(pCVar40,pcVar44);
                  goto LAB_00145ac5;
                }
LAB_00145af2:
                EVP_PKEY_free((EVP_PKEY *)CONCAT71(protocols._1_7_,protocols[0]));
                X509_free((X509 *)x509);
                OPENSSL_sk_pop_free(ptr,X509_free);
                bVar46 = false;
                pSVar11 = local_340;
                goto LAB_00144ac0;
              }
              pcVar44 = 
              "private key from PKCS12 file \'%s\' does not match certificate in same file";
              pXVar22 = local_338;
            }
            else {
              pcVar44 = "unable to use private key from PKCS12 file \'%s\'";
              pXVar22 = local_338;
            }
          }
          else {
            uVar13 = ERR_get_error();
            pXVar22 = (X509 *)ERR_error_string(uVar13,(char *)0x0);
            pcVar44 = "could not load PKCS12 client certificate, OpenSSL error %s";
          }
          Curl_failf(pCVar40,pcVar44,pXVar22);
LAB_00145ac5:
          EVP_PKEY_free((EVP_PKEY *)CONCAT71(protocols._1_7_,protocols[0]));
          X509_free((X509 *)x509);
          OPENSSL_sk_pop_free(ptr,X509_free);
          return CURLE_SSL_CERTPROBLEM;
        }
        if (iVar43 == 2) {
          iVar43 = SSL_CTX_use_certificate_file(local_340,(char *)local_338,2);
          bVar46 = true;
          if (iVar43 != 1) {
            uVar13 = ERR_get_error();
            type = (X509 *)ERR_error_string(uVar13,(char *)0x0);
            pcVar44 = 
            "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
            ;
            goto LAB_001453cb;
          }
        }
        else if (iVar43 == 0x2a) {
          e = (ENGINE *)(pCVar40->state).engine;
          if (e == (ENGINE *)0x0) {
            pcVar44 = "crypto engine not set, can\'t load certificate";
            goto LAB_00145a3b;
          }
          protocols[0] = (uchar)local_338;
          protocols._1_7_ = (undefined7)((ulong)local_338 >> 8);
          protocols[8] = '\0';
          protocols[9] = '\0';
          protocols[10] = '\0';
          protocols[0xb] = '\0';
          protocols[0xc] = '\0';
          protocols[0xd] = '\0';
          protocols[0xe] = '\0';
          protocols[0xf] = '\0';
          iVar43 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
          if (iVar43 == 0) {
            pcVar44 = "ssl engine does not support loading certificates";
            goto LAB_00145a3b;
          }
          iVar43 = ENGINE_ctrl_cmd((ENGINE *)(pCVar40->state).engine,"LOAD_CERT_CTRL",0,protocols,
                                   (f *)0x0,1);
          if (iVar43 == 0) {
            uVar13 = ERR_get_error();
            psVar16 = (stack_st_X509 *)ERR_error_string(uVar13,(char *)0x0);
            pcVar44 = "ssl engine cannot load client cert with id \'%s\' [%s]";
            pXVar22 = local_338;
            goto LAB_0014598c;
          }
          if ((X509 *)CONCAT71(protocols._9_7_,protocols[8]) == (X509 *)0x0) {
            pcVar44 = "ssl engine didn\'t initialized the certificate properly.";
            goto LAB_00145a3b;
          }
          iVar43 = SSL_CTX_use_certificate(local_340,(X509 *)CONCAT71(protocols._9_7_,protocols[8]))
          ;
          if (iVar43 != 1) {
            Curl_failf(pCVar40,"unable to set client certificate");
            X509_free((X509 *)CONCAT71(protocols._9_7_,protocols[8]));
            return CURLE_SSL_CERTPROBLEM;
          }
          X509_free((X509 *)CONCAT71(protocols._9_7_,protocols[8]));
          bVar46 = true;
          pSVar11 = local_340;
        }
        else {
          if (iVar43 != 1) {
            pcVar44 = "not supported file type \'%s\' for certificate";
            goto LAB_001453cb;
          }
          iVar43 = SSL_CTX_use_certificate_chain_file(local_340,(char *)local_338);
          bVar46 = true;
          if (iVar43 != 1) {
            uVar13 = ERR_get_error();
            type = (X509 *)ERR_error_string(uVar13,(char *)0x0);
            pcVar44 = 
            "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
            ;
            goto LAB_001453cb;
          }
        }
LAB_00144ac0:
        iVar43 = do_file_type((char *)local_318);
        if (iVar43 == 0x2b) {
          if (bVar46) {
            pcVar44 = "file type P12 for private key not supported";
            goto LAB_00145a3b;
          }
        }
        else {
          pXVar22 = local_308;
          if (iVar43 == 2) {
LAB_001453dc:
            iVar43 = SSL_CTX_use_PrivateKey_file(pSVar11,(char *)pXVar22,iVar43);
            if (iVar43 != 1) {
              psVar16 = (stack_st_X509 *)"PEM";
              if (local_318 != (stack_st_X509 *)0x0) {
                psVar16 = local_318;
              }
              pcVar44 = "unable to set private key file: \'%s\' type %s";
LAB_0014598c:
              Curl_failf(pCVar40,pcVar44,pXVar22,psVar16);
              return CURLE_SSL_CERTPROBLEM;
            }
          }
          else if (iVar43 == 0x2a) {
            if ((pCVar40->state).engine == (ENGINE *)0x0) {
              pcVar44 = "crypto engine not set, can\'t load private key";
              pCVar40 = local_348;
              goto LAB_00145a3b;
            }
            method = UI_create_method("cURL user interface");
            if (method == (UI_METHOD *)0x0) {
              pcVar44 = "unable do create OpenSSL user-interface method";
              pCVar40 = local_348;
              goto LAB_00145a3b;
            }
            pUVar33 = UI_OpenSSL();
            iVar43 = UI_method_get_opener((UI *)pUVar33);
            UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar43));
            pUVar33 = UI_OpenSSL();
            iVar43 = UI_method_get_closer((UI *)pUVar33);
            UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar43));
            UI_method_set_reader(method,ssl_ui_reader);
            UI_method_set_writer(method,ssl_ui_writer);
            pEVar35 = ENGINE_load_private_key
                                ((ENGINE *)(local_348->state).engine,(char *)local_308,method,
                                 (local_348->set).str[0xc]);
            UI_destroy_method(method);
            if (pEVar35 == (EVP_PKEY *)0x0) {
              pcVar44 = "failed to load private key from crypto engine";
              pCVar40 = local_348;
              goto LAB_00145a3b;
            }
            iVar43 = SSL_CTX_use_PrivateKey(local_340,pEVar35);
            if (iVar43 != 1) {
              Curl_failf(local_348,"unable to set private key");
              EVP_PKEY_free(pEVar35);
              return CURLE_SSL_CERTPROBLEM;
            }
            EVP_PKEY_free(pEVar35);
            pSVar11 = local_340;
            pCVar40 = local_348;
          }
          else {
            if (iVar43 != 1) {
              pcVar44 = "not supported file type for private key";
              goto LAB_00145a3b;
            }
            if (bVar46) {
              if (local_308 == (X509 *)0x0) {
                pXVar22 = local_338;
              }
              goto LAB_001453dc;
            }
          }
        }
        pSVar34 = SSL_new(pSVar11);
        if (pSVar34 == (SSL *)0x0) {
          pcVar44 = "unable to create an SSL structure";
LAB_00145a3b:
          Curl_failf(pCVar40,pcVar44);
          return CURLE_SSL_CERTPROBLEM;
        }
        x509 = (X509 *)SSL_get_certificate(pSVar34);
        if ((X509 *)x509 != (X509 *)0x0) {
          pEVar35 = X509_get_pubkey((X509 *)x509);
          from = SSL_get_privatekey(pSVar34);
          EVP_PKEY_copy_parameters(pEVar35,from);
          EVP_PKEY_free(pEVar35);
        }
        SSL_free(pSVar34);
        iVar43 = SSL_CTX_check_private_key(local_340);
        pcVar45 = local_330;
        if (iVar43 == 0) {
          pcVar44 = "Private key does not match the certificate public key";
          goto LAB_00145a3b;
        }
      }
    }
    pcVar44 = (pCVar27->set).str[0x17];
    pcVar10 = "ALL:!EXPORT:!EXPORT40:!EXPORT56:!aNULL:!LOW:!RC4:@STRENGTH";
    if (pcVar44 != (char *)0x0) {
      pcVar10 = pcVar44;
    }
    iVar43 = SSL_CTX_set_cipher_list((SSL_CTX *)conn->ssl[lVar36].ctx,pcVar10);
    if (iVar43 == 0) {
      Curl_failf(pCVar27,"failed setting cipher list: %s",pcVar10);
      return CURLE_SSL_CIPHER;
    }
    Curl_infof(pCVar27,"Cipher selection: %s\n",pcVar10);
    pcVar44 = (pCVar27->set).str[0x14];
    pcVar10 = (pCVar27->set).str[0x15];
    if (pcVar10 != (char *)0x0 || pcVar44 != (char *)0x0) {
      iVar43 = SSL_CTX_load_verify_locations((SSL_CTX *)conn->ssl[lVar36].ctx,pcVar10,pcVar44);
      if (iVar43 == 0) {
        if ((pCVar27->set).ssl.verifypeer == true) {
          pcVar44 = (pCVar27->set).str[0x15];
          if (pcVar44 == (char *)0x0) {
            pcVar44 = "none";
          }
          pcVar10 = (pCVar27->set).str[0x14];
          if (pcVar10 == (char *)0x0) {
            pcVar10 = "none";
          }
          Curl_failf(pCVar27,
                     "error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s",
                     pcVar44,pcVar10);
          return CURLE_SSL_CACERT_BADFILE;
        }
        pcVar44 = "error setting certificate verify locations, continuing anyway:\n";
      }
      else {
        pcVar44 = "successfully set certificate verify locations:\n";
      }
      Curl_infof(pCVar27,pcVar44);
      pcVar44 = (pCVar27->set).str[0x15];
      if (pcVar44 == (char *)0x0) {
        pcVar44 = "none";
      }
      Curl_infof(pCVar27,"  CAfile: %s\n  CApath: %s\n",pcVar44);
    }
    if ((pCVar27->set).str[0x1b] != (char *)0x0) {
      pXVar32 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar36].ctx);
      m = X509_LOOKUP_file();
      ctx = X509_STORE_add_lookup(pXVar32,m);
      if ((ctx == (X509_LOOKUP *)0x0) ||
         (iVar43 = X509_load_crl_file(ctx,(pCVar27->set).str[0x1b],1), iVar43 == 0)) {
        Curl_failf(pCVar27,"error loading CRL file: %s",(pCVar27->set).str[0x1b]);
        return CURLE_SSL_CRL_BADFILE;
      }
      Curl_infof(pCVar27,"successfully load CRL file:\n");
      pXVar32 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar36].ctx);
      X509_STORE_set_flags(pXVar32,0xc);
      pcVar44 = (pCVar27->set).str[0x1b];
      pcVar10 = "none";
      if (pcVar44 != (char *)0x0) {
        pcVar10 = pcVar44;
      }
      Curl_infof(pCVar27,"  CRLfile: %s\n",pcVar10);
    }
    SSL_CTX_set_verify((SSL_CTX *)conn->ssl[lVar36].ctx,(uint)(pCVar27->set).ssl.verifypeer,
                       (callback *)0x0);
    p_Var1 = (pCVar27->set).ssl.fsslctx;
    if ((p_Var1 != (curl_ssl_ctx_callback)0x0) &&
       (CVar4 = (*p_Var1)(pCVar27,conn->ssl[lVar36].ctx,(pCVar27->set).ssl.fsslctxp),
       CVar4 != CURLE_OK)) {
      pcVar44 = "error signaled by ssl ctx callback";
      goto LAB_00143b08;
    }
    pSVar34 = (SSL *)conn->ssl[lVar36].handle;
    if (pSVar34 != (SSL *)0x0) {
      SSL_free(pSVar34);
    }
    pSVar34 = SSL_new((SSL_CTX *)conn->ssl[lVar36].ctx);
    done = local_2f0;
    conn->ssl[lVar36].handle = (SSL *)pSVar34;
    if (pSVar34 == (SSL *)0x0) {
      Curl_failf(pCVar27,"SSL: couldn\'t create a context (handle)!");
      return CURLE_OUT_OF_MEMORY;
    }
    if ((pCVar27->set).ssl.verifystatus == true) {
      SSL_ctrl(pSVar34,0x41,1,(void *)0x0);
      pSVar34 = (SSL *)conn->ssl[lVar36].handle;
    }
    SSL_set_connect_state(pSVar34);
    conn->ssl[lVar36].server_cert = (X509 *)0x0;
    iVar43 = inet_pton(2,(pcVar45->host).name,&addr);
    if (((iVar43 == 0) && (iVar43 = inet_pton(10,(pcVar45->host).name,&addr), iVar43 == 0)) &&
       (lVar9 = SSL_ctrl((SSL *)conn->ssl[lVar36].handle,0x37,0,(pcVar45->host).name), lVar9 == 0))
    {
      Curl_infof(pCVar27,"WARNING: failed to configure server name indication (SNI) TLS extension\n"
                );
    }
    if ((pcVar45->ssl_config).sessionid == true) {
      protocols[0] = '\0';
      protocols[1] = '\0';
      protocols[2] = '\0';
      protocols[3] = '\0';
      protocols[4] = '\0';
      protocols[5] = '\0';
      protocols[6] = '\0';
      protocols[7] = '\0';
      Curl_ssl_sessionid_lock(pcVar45);
      _Var2 = Curl_ssl_getsessionid(pcVar45,(void **)protocols,(size_t *)0x0);
      if (!_Var2) {
        iVar43 = SSL_set_session((SSL *)conn->ssl[lVar36].handle,
                                 (SSL_SESSION *)CONCAT71(protocols._1_7_,protocols[0]));
        if (iVar43 == 0) {
          Curl_ssl_sessionid_unlock(pcVar45);
          uVar13 = ERR_get_error();
          pcVar44 = ERR_error_string(uVar13,(char *)0x0);
          pcVar10 = "SSL: SSL_set_session failed: %s";
          goto LAB_00145932;
        }
        Curl_infof(pCVar27,"SSL re-using session ID\n");
      }
      Curl_ssl_sessionid_unlock(pcVar45);
    }
    iVar3 = SSL_set_fd((SSL *)conn->ssl[lVar36].handle,iVar3);
    if (iVar3 == 0) {
      uVar13 = ERR_get_error();
      pcVar44 = ERR_error_string(uVar13,(char *)0x0);
      pcVar10 = "SSL: SSL_set_fd failed: %s";
LAB_00145932:
      Curl_failf(pCVar27,pcVar10,pcVar44);
      return CURLE_SSL_CONNECT_ERROR;
    }
    conn->ssl[lVar36].connecting_state = ssl_connect_2;
  }
  local_340 = (SSL_CTX *)CONCAT44(local_340._4_4_,0x23);
  local_2f0 = done;
  while (sVar42 - ssl_connect_2 < 3) {
    lVar9 = Curl_timeleft(pCVar37,(timeval *)0x0,true);
    if (lVar9 < 0) goto LAB_0014391a;
    sVar42 = conn->ssl[lVar36].connecting_state;
    if ((sVar42 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar42 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_350;
      }
      readfd0 = -1;
      if (sVar42 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_350;
      }
      if (nonblocking) {
        lVar9 = 0;
      }
      iVar3 = Curl_socket_check(readfd0,-1,writefd,lVar9);
      if (iVar3 < 0) {
        puVar12 = (uint *)__errno_location();
        Curl_failf(pCVar37,"select/poll on SSL socket, errno: %d",(ulong)*puVar12);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar3 == 0) {
        if (nonblocking) {
          *local_2f0 = false;
          return CURLE_OK;
        }
        goto LAB_0014391a;
      }
    }
    pCVar27 = pcVar45->data;
    ERR_clear_error();
    iVar3 = SSL_connect((SSL *)conn->ssl[lVar36].handle);
    if (iVar3 == 1) {
      conn->ssl[lVar36].connecting_state = ssl_connect_3;
      pSVar34 = (SSL *)conn->ssl[lVar36].handle;
      pcVar44 = "";
      if (pSVar34 != (SSL *)0x0) {
        iVar3 = SSL_version(pSVar34);
        pcVar44 = "TLSv1.2";
        switch(iVar3) {
        case 0x300:
          pcVar44 = "SSLv3";
          break;
        case 0x301:
          pcVar44 = "TLSv1.0";
          break;
        case 0x302:
          pcVar44 = "TLSv1.1";
          break;
        case 0x303:
          break;
        default:
          if (iVar3 == 2) {
            pcVar44 = "SSLv2";
          }
          else {
            pcVar44 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)conn->ssl[lVar36].handle);
      pcVar10 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar27,"SSL connection using %s / %s\n",pcVar44,pcVar10);
      pcVar45 = local_330;
      if ((local_330->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected(conn->ssl[lVar36].handle,protocols,&addr);
        if (addr.__in6_u.__u6_addr32[0] == 0) {
          Curl_infof(pCVar27,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar27,"ALPN, server accepted to use %.*s\n",addr.__in6_u._0_8_ & 0xffffffff,
                     CONCAT71(protocols._1_7_,protocols[0]));
          if ((addr.__in6_u.__u6_addr32[0] == 8) &&
             (*(long *)CONCAT71(protocols._1_7_,protocols[0]) == 0x312e312f70747468)) {
            pcVar45->negnpn = 2;
          }
        }
      }
    }
    else {
      iVar3 = SSL_get_error((SSL *)conn->ssl[lVar36].handle,iVar3);
      if (iVar3 == 3) {
        conn->ssl[lVar36].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (iVar3 != 2) {
          memset(protocols,0,0x100);
          conn->ssl[lVar36].connecting_state = ssl_connect_2;
          uVar13 = ERR_get_error();
          uVar7 = (uint)uVar13;
          if ((((int)uVar7 < 0) || ((uVar7 & 0xff800000) != 0xa000000)) ||
             ((uVar7 & 0x7fffff) != 0x86)) {
            ERR_error_string_n(uVar13,(char *)protocols,0x100);
            if (uVar13 == 0) {
              Curl_failf(pCVar27,"Unknown SSL protocol error in connection to %s:%ld ",
                         (pcVar45->host).name,(ulong)(uint)pcVar45->remote_port);
              return CURLE_SSL_CONNECT_ERROR;
            }
            CVar4 = CURLE_SSL_CONNECT_ERROR;
          }
          else {
            lVar36 = SSL_get_verify_result((SSL *)conn->ssl[lVar36].handle);
            if (lVar36 == 0) {
              builtin_memcpy(protocols,"SSL certificate verification failed",0x24);
            }
            else {
              pcVar44 = X509_verify_cert_error_string(lVar36);
              curl_msnprintf((char *)protocols,0x100,"SSL certificate problem: %s",pcVar44);
            }
            CVar4 = CURLE_SSL_CACERT;
          }
          Curl_failf(pCVar27,"%s",protocols);
          return CVar4;
        }
        conn->ssl[lVar36].connecting_state = ssl_connect_2_reading;
      }
    }
    sVar42 = conn->ssl[lVar36].connecting_state;
    if ((nonblocking) && (sVar42 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar42 == ssl_connect_3) {
    pCVar27 = pcVar45->data;
    if ((pcVar45->ssl_config).sessionid == true) {
      protocols[0] = '\0';
      protocols[1] = '\0';
      protocols[2] = '\0';
      protocols[3] = '\0';
      protocols[4] = '\0';
      protocols[5] = '\0';
      protocols[6] = '\0';
      protocols[7] = '\0';
      ses = SSL_get1_session((SSL *)conn->ssl[lVar36].handle);
      Curl_ssl_sessionid_lock(pcVar45);
      _Var2 = Curl_ssl_getsessionid(pcVar45,(void **)protocols,(size_t *)0x0);
      pcVar45 = local_330;
      if ((_Var2) || ((SSL_SESSION *)CONCAT71(protocols._1_7_,protocols[0]) == ses)) {
        if (_Var2) goto LAB_00143ade;
        SSL_SESSION_free(ses);
      }
      else {
        Curl_infof(pCVar27,"old SSL session ID is stale, removing\n");
        pcVar45 = local_330;
        Curl_ssl_delsessionid(local_330,(void *)CONCAT71(protocols._1_7_,protocols[0]));
LAB_00143ade:
        CVar4 = Curl_ssl_addsessionid(pcVar45,ses,0);
        if (CVar4 != CURLE_OK) {
          Curl_ssl_sessionid_unlock(pcVar45);
          pcVar44 = "failed to store ssl session";
LAB_00143b08:
          Curl_failf(pCVar27,pcVar44);
          return CVar4;
        }
      }
      Curl_ssl_sessionid_unlock(pcVar45);
    }
    cVar41 = '\x01';
    if ((pCVar27->set).ssl.verifypeer == false) {
      cVar41 = (pCVar27->set).ssl.verifyhost;
    }
    pCVar37 = pcVar45->data;
    pBVar14 = BIO_s_mem();
    pBVar15 = BIO_new(pBVar14);
    if ((pCVar37->set).ssl.certinfo == true) {
      pCVar27 = pcVar45->data;
      psVar16 = SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar36].handle);
      if (psVar16 != (stack_st_X509 *)0x0) {
        local_318 = psVar16;
        iVar3 = OPENSSL_sk_num(psVar16);
        CVar4 = Curl_ssl_init_certinfo(pCVar27,iVar3);
        if (CVar4 == CURLE_OK) {
          local_310 = pCVar37;
          local_2e0 = pBVar15;
          pBVar14 = BIO_s_mem();
          local_350 = (Curl_easy *)BIO_new(pBVar14);
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          local_308 = (X509 *)CONCAT44(local_308._4_4_,iVar3);
          for (iVar43 = 0; iVar43 != iVar3; iVar43 = iVar43 + 1) {
            local_348 = (Curl_easy *)OPENSSL_sk_value(local_318,iVar43);
            psig = (ASN1_BIT_STRING *)0x0;
            pXVar17 = X509_get_subject_name((X509 *)local_348);
            pCVar37 = local_350;
            X509_NAME_print_ex((BIO *)local_350,pXVar17,0,0x82031f);
            sVar18 = BIO_ctrl((BIO *)pCVar37,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar27,iVar43,"Subject",ptr,sVar18);
            BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
            pCVar40 = local_348;
            pXVar17 = X509_get_issuer_name((X509 *)local_348);
            X509_NAME_print_ex((BIO *)pCVar37,pXVar17,0,0x82031f);
            sVar18 = BIO_ctrl((BIO *)pCVar37,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar27,iVar43,"Issuer",ptr,sVar18);
            BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
            uVar19 = X509_get_version(pCVar40);
            BIO_printf((BIO *)pCVar37,"%lx",uVar19);
            sVar18 = BIO_ctrl((BIO *)pCVar37,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar27,iVar43,"Version",ptr,sVar18);
            BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
            pAVar20 = X509_get_serialNumber((X509 *)local_348);
            if (pAVar20->type == 0x102) {
              BIO_puts((BIO *)pCVar37,"-");
            }
            for (lVar9 = 0; pCVar37 = local_350, lVar9 < pAVar20->length; lVar9 = lVar9 + 1) {
              BIO_printf((BIO *)local_350,"%02x",(ulong)pAVar20->data[lVar9]);
            }
            sVar18 = BIO_ctrl((BIO *)local_350,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar27,iVar43,"Serial Number",ptr,sVar18);
            BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
            palg = (X509_ALGOR *)0x0;
            pAVar21 = ASN1_STRING_new();
            if (pAVar21 != (ASN1_STRING *)0x0) {
              X509_get0_signature(&psig,&palg,local_348);
              X509_signature_print((BIO *)pCVar37,(X509_ALGOR *)palg,pAVar21);
              ASN1_STRING_free(pAVar21);
              if (palg != (X509_ALGOR *)0x0) {
                i2a_ASN1_OBJECT((BIO *)pCVar37,(ASN1_OBJECT *)palg->algorithm);
                sVar18 = BIO_ctrl((BIO *)pCVar37,3,0,&ptr);
                Curl_ssl_push_certinfo_len(pCVar27,iVar43,"Public Key Algorithm",ptr,sVar18);
                BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
              }
            }
            pXVar22 = (X509 *)X509_get0_extensions(local_348);
            iVar3 = OPENSSL_sk_num(pXVar22);
            if (0 < iVar3) {
              local_338 = pXVar22;
              for (iVar3 = 0; pXVar22 = local_338, iVar5 = OPENSSL_sk_num(local_338), iVar3 < iVar5;
                  iVar3 = iVar3 + 1) {
                ex = (X509_EXTENSION *)OPENSSL_sk_value(pXVar22,iVar3);
                pBVar14 = BIO_s_mem();
                pBVar15 = BIO_new(pBVar14);
                pcVar45 = local_330;
                if (pBVar15 == (BIO *)0x0) break;
                a = X509_EXTENSION_get_object(ex);
                i2t_ASN1_OBJECT((char *)&addr,0x80,a);
                iVar5 = X509V3_EXT_print(pBVar15,ex,0,0);
                if (iVar5 == 0) {
                  v = X509_EXTENSION_get_data(ex);
                  ASN1_STRING_print(pBVar15,v);
                }
                BIO_ctrl(pBVar15,0x73,0,&x509);
                puVar39 = protocols;
                uVar13 = 0;
                while (uVar23 = *(ulong *)x509, uVar13 < uVar23) {
                  bVar46 = *(char *)(*(long *)(x509 + 8) + uVar13) == '\n';
                  pcVar44 = "";
                  if (bVar46) {
                    pcVar44 = ", ";
                  }
                  uVar13 = uVar13 + bVar46;
                  if (uVar23 <= uVar13) {
                    uVar23 = uVar13;
                  }
                  for (; uVar23 != uVar13; uVar13 = uVar13 + 1) {
                    if (*(char *)(*(long *)(x509 + 8) + uVar13) != ' ') {
                      iVar5 = curl_msnprintf((char *)puVar39,(size_t)(local_38 + -(long)puVar39),
                                             "%s%c",pcVar44);
                      puVar39 = puVar39 + iVar5;
                      uVar23 = uVar13;
                      break;
                    }
                  }
                  uVar13 = uVar23 + 1;
                }
                Curl_ssl_push_certinfo(pCVar27,iVar43,(char *)&addr,(char *)protocols);
                BIO_free(pBVar15);
                pcVar45 = local_330;
              }
            }
            pAVar24 = (ASN1_TIME *)X509_getm_notBefore(local_348);
            pCVar37 = local_350;
            ASN1_TIME_print((BIO *)local_350,pAVar24);
            sVar18 = BIO_ctrl((BIO *)pCVar37,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar27,iVar43,"Start date",ptr,sVar18);
            BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
            pAVar24 = (ASN1_TIME *)X509_getm_notAfter(local_348);
            ASN1_TIME_print((BIO *)pCVar37,pAVar24);
            sVar18 = BIO_ctrl((BIO *)pCVar37,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar27,iVar43,"Expire date",ptr,sVar18);
            BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
            pXVar22 = (X509 *)X509_get_pubkey((X509 *)local_348);
            if (pXVar22 == (X509 *)0x0) {
              Curl_infof(pCVar27,"   Unable to load public key\n");
            }
            else {
              iVar3 = EVP_PKEY_get_id(pXVar22);
              if (iVar3 == 0x74) {
                uVar19 = EVP_PKEY_get0_DSA(pXVar22);
                local_338 = pXVar22;
                DSA_get0_pqg(uVar19,protocols,&addr,&x509);
                DSA_get0_key(uVar19,&q,&palg);
                pubkey_show(pCVar27,(BIO *)local_350,iVar43,"dsa","p",
                            (BIGNUM *)CONCAT71(protocols._1_7_,protocols[0]));
                pubkey_show(pCVar27,(BIO *)local_350,iVar43,"dsa","q",(BIGNUM *)addr.__in6_u._0_8_);
                pCVar37 = local_350;
                pubkey_show(pCVar27,(BIO *)local_350,iVar43,"dsa","g",(BIGNUM *)x509);
                pubkey_show(pCVar27,(BIO *)pCVar37,iVar43,"dsa","priv_key",(BIGNUM *)palg);
                pcVar44 = "dsa";
LAB_0014451a:
                pcVar10 = "pub_key";
                bn = q;
LAB_00144521:
                pXVar22 = local_338;
                pubkey_show(pCVar27,(BIO *)pCVar37,iVar43,pcVar44,pcVar10,bn);
              }
              else {
                if (iVar3 == 0x1c) {
                  uVar19 = EVP_PKEY_get0_DH(pXVar22);
                  local_338 = pXVar22;
                  DH_get0_pqg(uVar19,protocols,&addr,&x509);
                  DH_get0_key(uVar19,&q,&palg);
                  pubkey_show(pCVar27,(BIO *)local_350,iVar43,"dh","p",
                              (BIGNUM *)CONCAT71(protocols._1_7_,protocols[0]));
                  pubkey_show(pCVar27,(BIO *)local_350,iVar43,"dh","q",(BIGNUM *)addr.__in6_u._0_8_)
                  ;
                  pCVar37 = local_350;
                  pubkey_show(pCVar27,(BIO *)local_350,iVar43,"dh","g",(BIGNUM *)x509);
                  pubkey_show(pCVar27,(BIO *)pCVar37,iVar43,"dh","priv_key",(BIGNUM *)palg);
                  pcVar44 = "dh";
                  goto LAB_0014451a;
                }
                if (iVar3 == 6) {
                  uVar19 = EVP_PKEY_get0_RSA(pXVar22);
                  local_338 = pXVar22;
                  RSA_get0_key(uVar19,protocols,&addr,&x509);
                  RSA_get0_factors(uVar19,&palg,&q);
                  RSA_get0_crt_params(uVar19,&dmp1,&dmq1,&iqmp);
                  pCVar37 = local_350;
                  BN_print(local_350,(BIGNUM *)CONCAT71(protocols._1_7_,protocols[0]));
                  sVar18 = BIO_ctrl((BIO *)pCVar37,3,0,&ptr);
                  Curl_ssl_push_certinfo_len(pCVar27,iVar43,"RSA Public Key",ptr,sVar18);
                  BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
                  pubkey_show(pCVar27,(BIO *)pCVar37,iVar43,"rsa","n",
                              (BIGNUM *)CONCAT71(protocols._1_7_,protocols[0]));
                  pubkey_show(pCVar27,(BIO *)local_350,iVar43,"rsa","e",(BIGNUM *)addr.__in6_u._0_8_
                             );
                  pCVar37 = local_350;
                  pubkey_show(pCVar27,(BIO *)local_350,iVar43,"rsa","d",(BIGNUM *)x509);
                  pubkey_show(pCVar27,(BIO *)pCVar37,iVar43,"rsa","p",(BIGNUM *)palg);
                  pubkey_show(pCVar27,(BIO *)pCVar37,iVar43,"rsa","q",q);
                  pubkey_show(pCVar27,(BIO *)pCVar37,iVar43,"rsa","dmp1",dmp1);
                  pubkey_show(pCVar27,(BIO *)pCVar37,iVar43,"rsa","dmq1",dmq1);
                  pcVar44 = "rsa";
                  pcVar10 = "iqmp";
                  bn = iqmp;
                  goto LAB_00144521;
                }
              }
              EVP_PKEY_free((EVP_PKEY *)pXVar22);
            }
            if (psig != (ASN1_BIT_STRING *)0x0) {
              for (lVar9 = 0; pCVar37 = local_350, lVar9 < psig->length; lVar9 = lVar9 + 1) {
                BIO_printf((BIO *)local_350,"%02x:",(ulong)psig->data[lVar9]);
              }
              sVar18 = BIO_ctrl((BIO *)local_350,3,0,&ptr);
              Curl_ssl_push_certinfo_len(pCVar27,iVar43,"Signature",ptr,sVar18);
              BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
            }
            pCVar37 = local_350;
            PEM_write_bio_X509((BIO *)local_350,(X509 *)local_348);
            sVar18 = BIO_ctrl((BIO *)pCVar37,3,0,&ptr);
            Curl_ssl_push_certinfo_len(pCVar27,iVar43,"Cert",ptr,sVar18);
            BIO_ctrl((BIO *)pCVar37,1,0,(void *)0x0);
            iVar3 = (int)local_308;
          }
          BIO_free((BIO *)local_350);
          pBVar15 = local_2e0;
          pCVar37 = local_310;
        }
      }
    }
    pXVar25 = (X509 *)SSL_get1_peer_certificate(conn->ssl[lVar36].handle);
    conn->ssl[lVar36].server_cert = pXVar25;
    if (pXVar25 == (X509 *)0x0) {
      if (cVar41 != '\0') {
        Curl_failf(pCVar37,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      pcVar44 = (pCVar37->state).buffer;
      Curl_infof(pCVar37,"Server certificate:\n");
      pXVar17 = X509_get_subject_name((X509 *)conn->ssl[lVar36].server_cert);
      iVar3 = x509_name_oneline((X509_NAME *)pXVar17,pcVar44,size);
      pcVar10 = "[NONE]";
      if (iVar3 == 0) {
        pcVar10 = pcVar44;
      }
      local_338 = (X509 *)pcVar44;
      Curl_infof(pCVar37," subject: %s\n",pcVar10);
      pAVar24 = (ASN1_TIME *)X509_getm_notBefore(conn->ssl[lVar36].server_cert);
      ASN1_TIME_print(pBVar15,pAVar24);
      lVar9 = BIO_ctrl(pBVar15,3,0,&local_2d8);
      Curl_infof(pCVar37," start date: %.*s\n",lVar9);
      BIO_ctrl(pBVar15,1,0,(void *)0x0);
      pAVar24 = (ASN1_TIME *)X509_getm_notAfter(conn->ssl[lVar36].server_cert);
      ASN1_TIME_print(pBVar15,pAVar24);
      lVar9 = BIO_ctrl(pBVar15,3,0,&local_2d8);
      Curl_infof(pCVar37," expire date: %.*s\n",lVar9);
      pcVar45 = local_330;
      BIO_ctrl(pBVar15,1,0,(void *)0x0);
      BIO_free(pBVar15);
      if ((pCVar37->set).ssl.verifyhost == true) {
        pXVar22 = (X509 *)conn->ssl[lVar36].server_cert;
        local_348 = pcVar45->data;
        local_310 = pCVar37;
        if (((pcVar45->bits).ipv6_ip == true) &&
           (iVar3 = inet_pton(10,(pcVar45->host).name,protocols), iVar3 != 0)) {
          iVar3 = 7;
          sVar29 = 0x10;
        }
        else {
          iVar3 = inet_pton(2,(pcVar45->host).name,protocols);
          sVar29 = (size_t)((uint)(iVar3 != 0) * 4);
          iVar3 = (uint)(iVar3 != 0) * 5 + 2;
        }
        pCVar37 = (Curl_easy *)0x0;
        a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar22,0x55,(int *)0x0,(int *)0x0);
        if (a_00 != (GENERAL_NAMES *)0x0) {
          local_308 = pXVar22;
          iVar43 = OPENSSL_sk_num(a_00);
          iVar5 = 0;
          bVar46 = false;
          local_318 = (stack_st_X509 *)0x0;
          local_350 = (Curl_easy *)0x0;
          local_368 = (Curl_easy *)0x0;
          while ((iVar5 < iVar43 && (!bVar46))) {
            piVar26 = (int *)OPENSSL_sk_value(a_00,iVar5);
            iVar6 = *piVar26;
            uVar38 = (undefined7)((ulong)pCVar37 >> 8);
            if (iVar6 == 2) {
              pCVar37 = (Curl_easy *)CONCAT71(uVar38,1);
              local_368 = pCVar37;
            }
            else if (iVar6 == 7) {
              pCVar37 = (Curl_easy *)CONCAT71(uVar38,1);
              local_350 = pCVar37;
            }
            if (iVar6 == iVar3) {
              pCVar27 = (Curl_easy *)ASN1_STRING_data(*(ASN1_STRING **)(piVar26 + 2));
              iVar6 = ASN1_STRING_length(*(ASN1_STRING **)(piVar26 + 2));
              if (iVar3 == 7) {
                if ((sVar29 != (long)iVar6) || (iVar6 = bcmp(pCVar27,protocols,sVar29), iVar6 != 0))
                goto LAB_001448fa;
                bVar46 = false;
                Curl_infof(local_348," subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                           (local_330->host).dispname);
                local_318 = (stack_st_X509 *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              }
              else {
                if (((iVar3 != 2) ||
                    (sVar28 = strlen((char *)pCVar27), pcVar45 = local_330, sVar28 != (long)iVar6))
                   || (iVar6 = Curl_cert_hostcheck((char *)pCVar27,(local_330->host).name),
                      iVar6 == 0)) goto LAB_001448fa;
                Curl_infof(local_348," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                           (pcVar45->host).dispname);
                bVar46 = true;
                pCVar37 = pCVar27;
              }
            }
            else {
LAB_001448fa:
              bVar46 = false;
            }
            iVar5 = iVar5 + 1;
          }
          GENERAL_NAMES_free(a_00);
          pcVar45 = local_330;
          pCVar27 = local_348;
          pCVar37 = local_310;
          if (bVar46 || ((ulong)local_318 & 1) != 0) goto LAB_00144ddf;
          pXVar22 = local_308;
          if ((char)local_368 == '\0' && ((ulong)local_350 & 1) == 0) goto LAB_001449af;
          Curl_infof(local_348," subjectAltName does not match %s\n",(local_330->host).dispname);
          Curl_failf(pCVar27,
                     "SSL: no alternative certificate subject name matches target host name \'%s\'",
                     (pcVar45->host).dispname);
LAB_001449a1:
          CStack_380 = CURLE_PEER_FAILED_VERIFICATION;
          goto LAB_00144f7e;
        }
LAB_001449af:
        addr.__in6_u._0_8_ = (long)"user=%s\x01host=%s\x01port=%ld\x01auth=Bearer %s\x01\x01" + 0x29
        ;
        pXVar17 = X509_get_subject_name(pXVar22);
        if (pXVar17 == (X509_NAME *)0x0) {
LAB_00144d16:
          pcVar45 = local_330;
          if ((char *)addr.__in6_u._0_8_ == "") {
            addr.__in6_u._0_8_ = 0;
            goto LAB_00144d6d;
          }
          if (addr.__in6_u._0_8_ == 0) goto LAB_00144d6d;
          iVar3 = Curl_cert_hostcheck((char *)addr.__in6_u._0_8_,(local_330->host).name);
          if (iVar3 == 0) {
            Curl_failf(local_348,
                       "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                       ,addr.__in6_u._0_8_);
            CStack_380 = CURLE_PEER_FAILED_VERIFICATION;
          }
          else {
            CStack_380 = CURLE_OK;
            Curl_infof(local_348," common name: %s (matched)\n");
          }
        }
        else {
          iVar3 = -1;
          do {
            iVar43 = iVar3;
            iVar3 = X509_NAME_get_index_by_NID(pXVar17,0xd,iVar43);
          } while (-1 < iVar3);
          if (iVar43 < 0) goto LAB_00144d16;
          ne = X509_NAME_get_entry(pXVar17,iVar43);
          pAVar21 = X509_NAME_ENTRY_get_data(ne);
          if (pAVar21 == (ASN1_STRING *)0x0) goto LAB_00144d16;
          iVar3 = ASN1_STRING_type(pAVar21);
          if (iVar3 == 0xc) {
            uVar7 = ASN1_STRING_length(pAVar21);
            if ((int)uVar7 < 0) {
              uVar19 = "";
            }
            else {
              uVar19 = CRYPTO_malloc(uVar7 + 1,
                                     "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/lib/vtls/openssl.c"
                                     ,0x4bd);
              addr.__in6_u._0_8_ = uVar19;
              if ((char *)uVar19 == (char *)0x0) goto LAB_00144d6d;
              puVar39 = ASN1_STRING_data(pAVar21);
              memcpy((void *)uVar19,puVar39,(ulong)uVar7);
              *(char *)(uVar19 + (ulong)uVar7) = '\0';
            }
LAB_00144cfe:
            sVar29 = strlen((char *)uVar19);
            uVar8 = curlx_uztosi(sVar29);
            if (uVar8 == uVar7) goto LAB_00144d16;
            Curl_failf(local_348,"SSL: illegal cert name field");
            if ((char *)addr.__in6_u._0_8_ == "") goto LAB_001449a1;
            CStack_380 = CURLE_PEER_FAILED_VERIFICATION;
            pcVar45 = local_330;
            goto LAB_00144dc0;
          }
          uVar7 = ASN1_STRING_to_UTF8((uchar **)&addr,pAVar21);
          uVar19 = addr.__in6_u._0_8_;
          if (addr.__in6_u._0_8_ != 0) goto LAB_00144cfe;
LAB_00144d6d:
          Curl_failf(local_348,"SSL: unable to obtain common name from peer certificate");
          CStack_380 = CURLE_PEER_FAILED_VERIFICATION;
          pcVar45 = local_330;
        }
LAB_00144dc0:
        pCVar37 = local_310;
        if (addr.__in6_u._0_8_ != 0) {
          CRYPTO_free((void *)addr.__in6_u._0_8_);
        }
        if (CStack_380 != CURLE_OK) goto LAB_00144f7e;
      }
LAB_00144ddf:
      pXVar17 = X509_get_issuer_name((X509 *)conn->ssl[lVar36].server_cert);
      pXVar22 = local_338;
      iVar3 = x509_name_oneline((X509_NAME *)pXVar17,(char *)local_338,size_00);
      if (iVar3 == 0) {
        Curl_infof(pCVar37," issuer: %s\n",pXVar22);
        pcVar44 = (pCVar37->set).str[0x1c];
        if (pcVar44 != (char *)0x0) {
          pFVar30 = fopen64(pcVar44,"r");
          if (pFVar30 == (FILE *)0x0) {
            if (cVar41 != '\0') {
              Curl_failf(pCVar37,"SSL: Unable to open issuer cert (%s)",(pCVar37->set).str[0x1c]);
            }
            pXVar22 = (X509 *)conn->ssl[lVar36].server_cert;
LAB_001450de:
            X509_free(pXVar22);
            conn->ssl[lVar36].server_cert = (X509 *)0x0;
            return CURLE_SSL_ISSUER_ERROR;
          }
          pXVar22 = PEM_read_X509(pFVar30,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar22 == (X509 *)0x0) {
            if (cVar41 != '\0') {
              Curl_failf(pCVar37,"SSL: Unable to read issuer cert (%s)",(pCVar37->set).str[0x1c]);
            }
            X509_free((X509 *)conn->ssl[lVar36].server_cert);
            X509_free((X509 *)0x0);
            fclose(pFVar30);
            return CURLE_SSL_ISSUER_ERROR;
          }
          fclose(pFVar30);
          iVar3 = X509_check_issued(pXVar22,(X509 *)conn->ssl[lVar36].server_cert);
          if (iVar3 != 0) {
            if (cVar41 != '\0') {
              Curl_failf(pCVar37,"SSL: Certificate issuer check failed (%s)",
                         (pCVar37->set).str[0x1c]);
            }
            X509_free((X509 *)conn->ssl[lVar36].server_cert);
            goto LAB_001450de;
          }
          Curl_infof(pCVar37," SSL certificate issuer check ok (%s)\n",(pCVar37->set).str[0x1c]);
          X509_free(pXVar22);
        }
        lVar9 = SSL_get_verify_result((SSL *)conn->ssl[lVar36].handle);
        (pCVar37->set).ssl.certverifyresult = lVar9;
        if (lVar9 == 0) {
          local_340 = (SSL_CTX *)((ulong)local_340._4_4_ << 0x20);
          Curl_infof(pCVar37," SSL certificate verify ok.\n");
        }
        else if ((pCVar37->set).ssl.verifypeer == true) {
          local_340 = (SSL_CTX *)CONCAT44(local_340._4_4_,0x33);
          if (cVar41 != '\0') {
            pcVar44 = X509_verify_cert_error_string(lVar9);
            Curl_failf(pCVar37,"SSL certificate verify result: %s (%ld)",pcVar44,lVar9);
          }
        }
        else {
          pcVar44 = X509_verify_cert_error_string(lVar9);
          local_340 = (SSL_CTX *)((ulong)local_340 & 0xffffffff00000000);
          Curl_infof(pCVar37," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                     pcVar44,lVar9);
        }
      }
      else if (cVar41 != '\0') {
        Curl_failf(pCVar37,"SSL: couldn\'t get X509-issuer name!");
      }
      if ((pCVar37->set).ssl.verifystatus == true) {
        pCVar27 = pcVar45->data;
        lVar9 = SSL_ctrl((SSL *)conn->ssl[lVar36].handle,0x46,0,protocols);
        if (CONCAT71(protocols._1_7_,protocols[0]) == 0) {
          pcVar44 = "No OCSP response received";
LAB_00144f60:
          resp = (OCSP_RESPONSE *)0x0;
          Curl_failf(pCVar27,pcVar44);
          CStack_380 = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)protocols,lVar9);
          if (resp == (OCSP_RESPONSE *)0x0) {
            pcVar44 = "Invalid OCSP response";
            goto LAB_00144f60;
          }
          uVar7 = OCSP_response_status(resp);
          if (uVar7 == 0) {
            bs = OCSP_response_get1_basic(resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              Curl_failf(pCVar27,"Invalid OCSP response");
              CStack_380 = CURLE_SSL_INVALIDCERTSTATUS;
              pcVar45 = local_330;
            }
            else {
              psVar16 = SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar36].handle);
              pXVar32 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar36].ctx);
              iVar3 = OCSP_basic_verify(bs,psVar16,pXVar32,0);
              if (iVar3 < 1) {
                Curl_failf(pCVar27,"OCSP response verification failed");
                CStack_380 = CURLE_SSL_INVALIDCERTSTATUS;
              }
              else {
                local_350 = pCVar27;
                for (iVar3 = 0; iVar43 = OCSP_resp_count(bs), iVar3 < iVar43; iVar3 = iVar3 + 1) {
                  single = OCSP_resp_get0(bs,iVar3);
                  if (single != (OCSP_SINGLERESP *)0x0) {
                    uVar7 = OCSP_single_get0_status
                                      (single,(int *)&psig,(ASN1_GENERALIZEDTIME **)&addr,
                                       (ASN1_GENERALIZEDTIME **)&x509,(ASN1_GENERALIZEDTIME **)&ptr)
                    ;
                    iVar43 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)x509,
                                                 (ASN1_GENERALIZEDTIME *)ptr,300,-1);
                    if (iVar43 == 0) {
                      Curl_failf(local_350,"OCSP response has expired");
                    }
                    else {
                      pcVar44 = OCSP_cert_status_str((long)(int)uVar7);
                      Curl_infof(local_350,"SSL certificate status: %s (%d)\n",pcVar44,(ulong)uVar7)
                      ;
                      if (uVar7 != 2) {
                        if (uVar7 != 1) goto LAB_001451e7;
                        pcVar44 = OCSP_crl_reason_str((long)(int)psig);
                        Curl_failf(local_350,"SSL certificate revocation reason: %s (%d)",pcVar44,
                                   (ulong)psig & 0xffffffff);
                      }
                    }
                    CStack_380 = CURLE_SSL_INVALIDCERTSTATUS;
                    goto LAB_001459f5;
                  }
LAB_001451e7:
                }
                CStack_380 = CURLE_OK;
              }
LAB_001459f5:
              OCSP_BASICRESP_free(bs);
              pcVar45 = local_330;
            }
          }
          else {
            pcVar44 = OCSP_response_status_str((long)(int)uVar7);
            Curl_failf(pCVar27,"Invalid OCSP response status: %s (%d)",pcVar44,(ulong)uVar7);
            CStack_380 = CURLE_SSL_INVALIDCERTSTATUS;
          }
        }
        OCSP_RESPONSE_free(resp);
        if (CStack_380 != CURLE_OK) {
LAB_00144f7e:
          X509_free((X509 *)conn->ssl[lVar36].server_cert);
          conn->ssl[lVar36].server_cert = (X509 *)0x0;
          return CStack_380;
        }
        local_340 = (SSL_CTX *)((ulong)local_340 & 0xffffffff00000000);
      }
      CVar4 = CURLE_OK;
      if (cVar41 != '\0') {
        CVar4 = (CURLcode)local_340;
      }
      pcVar44 = (pCVar37->set).str[0x16];
      local_2d8 = pcVar44;
      if (pcVar44 != (char *)0x0 && CVar4 == CURLE_OK) {
        pXVar25 = conn->ssl[lVar36].server_cert;
        if (pXVar25 == (X509 *)0x0) {
LAB_0014507b:
          CVar4 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          pXVar31 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar25);
          uVar7 = i2d_X509_PUBKEY(pXVar31,(uchar **)0x0);
          if ((int)uVar7 < 1) goto LAB_0014507b;
          puVar39 = (uchar *)CRYPTO_malloc(uVar7,
                                           "/workspace/llm4binary/github/license_all_cmakelists_1510/xyzz[P]vita-curl/lib/vtls/openssl.c"
                                           ,0xa45);
          protocols[0] = (uchar)puVar39;
          protocols._1_7_ = (undefined7)((ulong)puVar39 >> 8);
          if (puVar39 == (uchar *)0x0) goto LAB_0014507b;
          pXVar31 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar25);
          uVar8 = i2d_X509_PUBKEY(pXVar31,(uchar **)protocols);
          if ((CONCAT71(protocols._1_7_,protocols[0]) == 0 || uVar7 != uVar8) ||
              CONCAT71(protocols._1_7_,protocols[0]) - (long)puVar39 != (ulong)uVar7) {
            CVar4 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            CVar4 = Curl_pin_peer_pubkey(pCVar37,pcVar44,puVar39,(ulong)uVar7);
          }
          CRYPTO_free(puVar39);
          if (CVar4 == CURLE_OK) {
            CVar4 = CURLE_OK;
            pcVar45 = local_330;
            goto LAB_0014509a;
          }
        }
        pcVar45 = local_330;
        Curl_failf(pCVar37,"SSL: public key does not match pinned public key!");
      }
LAB_0014509a:
      X509_free((X509 *)conn->ssl[lVar36].server_cert);
      conn->ssl[lVar36].server_cert = (X509 *)0x0;
      conn->ssl[lVar36].connecting_state = ssl_connect_done;
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
    }
  }
  else if (sVar42 != ssl_connect_done) {
    _Var2 = false;
    goto LAB_001439b6;
  }
  conn->ssl[lVar36].state = ssl_connection_complete;
  pcVar45->recv[local_2e8] = ossl_recv;
  pcVar45->send[local_2e8] = ossl_send;
  _Var2 = true;
LAB_001439b6:
  *local_2f0 = _Var2;
  conn->ssl[lVar36].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  long timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_ready(readfd, writefd, nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      else if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        else {
          /* timeout */
          failf(data, "SSL connection timeout");
          return CURLE_OPERATION_TIMEDOUT;
        }
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}